

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionHandler::handleExpr<unsigned_long_const&>
          (AssertionHandler *this,ExprLhs<const_unsigned_long_&> *expr)

{
  UnaryExpr<const_unsigned_long_&> local_30;
  ExprLhs<const_unsigned_long_&> *local_18;
  ExprLhs<const_unsigned_long_&> *expr_local;
  AssertionHandler *this_local;
  
  local_18 = expr;
  expr_local = (ExprLhs<const_unsigned_long_&> *)this;
  ExprLhs<const_unsigned_long_&>::makeUnaryExpr(&local_30,expr);
  handleExpr(this,&local_30.super_ITransientExpression);
  UnaryExpr<const_unsigned_long_&>::~UnaryExpr(&local_30);
  return;
}

Assistant:

void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }